

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPackingFunctionTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderPackingFunctionTests::init
          (ShaderPackingFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  PackSnorm2x16Case *pPVar1;
  TestNode *pTVar2;
  PackUnorm2x16Case *pPVar3;
  
  pPVar1 = (PackSnorm2x16Case *)operator_new(0x108);
  PackSnorm2x16Case::PackSnorm2x16Case
            (pPVar1,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX,PRECISION_LOWP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PackSnorm2x16Case *)operator_new(0x108);
  PackSnorm2x16Case::PackSnorm2x16Case
            (pPVar1,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT,PRECISION_LOWP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PackSnorm2x16Case *)operator_new(0x108);
  PackSnorm2x16Case::PackSnorm2x16Case
            (pPVar1,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX,PRECISION_MEDIUMP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PackSnorm2x16Case *)operator_new(0x108);
  PackSnorm2x16Case::PackSnorm2x16Case
            (pPVar1,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT,PRECISION_MEDIUMP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PackSnorm2x16Case *)operator_new(0x108);
  PackSnorm2x16Case::PackSnorm2x16Case
            (pPVar1,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX,PRECISION_HIGHP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pPVar1 = (PackSnorm2x16Case *)operator_new(0x108);
  PackSnorm2x16Case::PackSnorm2x16Case
            (pPVar1,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT,PRECISION_HIGHP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar1);
  pTVar2 = (TestNode *)operator_new(0x100);
  UnpackSnorm2x16Case::UnpackSnorm2x16Case
            ((UnpackSnorm2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x100);
  UnpackSnorm2x16Case::UnpackSnorm2x16Case
            ((UnpackSnorm2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT
            );
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pPVar3 = (PackUnorm2x16Case *)operator_new(0x108);
  PackUnorm2x16Case::PackUnorm2x16Case
            (pPVar3,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX,PRECISION_LOWP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar3);
  pPVar3 = (PackUnorm2x16Case *)operator_new(0x108);
  PackUnorm2x16Case::PackUnorm2x16Case
            (pPVar3,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT,PRECISION_LOWP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar3);
  pPVar3 = (PackUnorm2x16Case *)operator_new(0x108);
  PackUnorm2x16Case::PackUnorm2x16Case
            (pPVar3,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX,PRECISION_MEDIUMP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar3);
  pPVar3 = (PackUnorm2x16Case *)operator_new(0x108);
  PackUnorm2x16Case::PackUnorm2x16Case
            (pPVar3,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT,PRECISION_MEDIUMP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar3);
  pPVar3 = (PackUnorm2x16Case *)operator_new(0x108);
  PackUnorm2x16Case::PackUnorm2x16Case
            (pPVar3,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX,PRECISION_HIGHP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar3);
  pPVar3 = (PackUnorm2x16Case *)operator_new(0x108);
  PackUnorm2x16Case::PackUnorm2x16Case
            (pPVar3,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT,PRECISION_HIGHP);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar3);
  pTVar2 = (TestNode *)operator_new(0x100);
  UnpackUnorm2x16Case::UnpackUnorm2x16Case
            ((UnpackUnorm2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x100);
  UnpackUnorm2x16Case::UnpackUnorm2x16Case
            ((UnpackUnorm2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT
            );
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x100);
  PackHalf2x16Case::PackHalf2x16Case
            ((PackHalf2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x100);
  PackHalf2x16Case::PackHalf2x16Case
            ((PackHalf2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x100);
  UnpackHalf2x16Case::UnpackHalf2x16Case
            ((UnpackHalf2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,SHADERTYPE_VERTEX);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x100);
  UnpackHalf2x16Case::UnpackHalf2x16Case
            ((UnpackHalf2x16Case *)pTVar2,(this->super_TestCaseGroup).m_context,SHADERTYPE_FRAGMENT)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void ShaderPackingFunctionTests::init (void)
{
	addChild(new PackSnorm2x16Case	(m_context, glu::SHADERTYPE_VERTEX,		glu::PRECISION_LOWP));
	addChild(new PackSnorm2x16Case	(m_context, glu::SHADERTYPE_FRAGMENT,	glu::PRECISION_LOWP));
	addChild(new PackSnorm2x16Case	(m_context, glu::SHADERTYPE_VERTEX,		glu::PRECISION_MEDIUMP));
	addChild(new PackSnorm2x16Case	(m_context, glu::SHADERTYPE_FRAGMENT,	glu::PRECISION_MEDIUMP));
	addChild(new PackSnorm2x16Case	(m_context, glu::SHADERTYPE_VERTEX,		glu::PRECISION_HIGHP));
	addChild(new PackSnorm2x16Case	(m_context, glu::SHADERTYPE_FRAGMENT,	glu::PRECISION_HIGHP));

	addChild(new UnpackSnorm2x16Case(m_context, glu::SHADERTYPE_VERTEX));
	addChild(new UnpackSnorm2x16Case(m_context, glu::SHADERTYPE_FRAGMENT));

	addChild(new PackUnorm2x16Case	(m_context, glu::SHADERTYPE_VERTEX,		glu::PRECISION_LOWP));
	addChild(new PackUnorm2x16Case	(m_context, glu::SHADERTYPE_FRAGMENT,	glu::PRECISION_LOWP));
	addChild(new PackUnorm2x16Case	(m_context, glu::SHADERTYPE_VERTEX,		glu::PRECISION_MEDIUMP));
	addChild(new PackUnorm2x16Case	(m_context, glu::SHADERTYPE_FRAGMENT,	glu::PRECISION_MEDIUMP));
	addChild(new PackUnorm2x16Case	(m_context, glu::SHADERTYPE_VERTEX,		glu::PRECISION_HIGHP));
	addChild(new PackUnorm2x16Case	(m_context, glu::SHADERTYPE_FRAGMENT,	glu::PRECISION_HIGHP));

	addChild(new UnpackUnorm2x16Case(m_context, glu::SHADERTYPE_VERTEX));
	addChild(new UnpackUnorm2x16Case(m_context, glu::SHADERTYPE_FRAGMENT));

	addChild(new PackHalf2x16Case	(m_context, glu::SHADERTYPE_VERTEX));
	addChild(new PackHalf2x16Case	(m_context, glu::SHADERTYPE_FRAGMENT));

	addChild(new UnpackHalf2x16Case	(m_context, glu::SHADERTYPE_VERTEX));
	addChild(new UnpackHalf2x16Case	(m_context, glu::SHADERTYPE_FRAGMENT));
}